

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::Symbol_const*&&,slang::SmallVector<slang::analysis::DataFlowState,2ul>&&>>
          (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
           *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::Symbol_*&&,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_&&>
          *args)

{
  int iVar1;
  uint n_;
  size_t sVar2;
  group_type *pgVar3;
  value_type *pvVar4;
  size_t in_RCX;
  long in_RDX;
  group15<boost::unordered::detail::foa::plain_integral> *in_RSI;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
  *in_RDI;
  value_type *p;
  uint n;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  element_type *in_stack_ffffffffffffff88;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
  *pos_00;
  pow2_quadratic_prober local_38 [2];
  long local_10;
  
  pos_00 = in_RDI;
  local_10 = in_RDX;
  pow2_quadratic_prober::pow2_quadratic_prober(local_38,in_RCX);
  while( true ) {
    sVar2 = pow2_quadratic_prober::get(local_38);
    pgVar3 = table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
             ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                       *)0x81db39);
    iVar1 = group15<boost::unordered::detail::foa::plain_integral>::match_available
                      ((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_ffffffffffffff88);
    if (iVar1 != 0) break;
    group15<boost::unordered::detail::foa::plain_integral>::mark_overflow
              ((group15<boost::unordered::detail::foa::plain_integral> *)in_RDI,
               (size_t)in_stack_ffffffffffffff88);
    pow2_quadratic_prober::next(local_38,*(size_t *)(local_10 + 8));
  }
  n_ = unchecked_countr_zero(0);
  pvVar4 = table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
           ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                       *)0x81db7a);
  construct_element<std::pair<slang::ast::Symbol_const*&&,slang::SmallVector<slang::analysis::DataFlowState,2ul>&&>>
            (in_RDI,in_stack_ffffffffffffff88,
             (pair<const_slang::ast::Symbol_*&&,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_&&>
              *)0x81dbb1);
  group15<boost::unordered::detail::foa::plain_integral>::set(in_RSI,(size_t)pos_00,(size_t)in_RDI);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
  ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
                   *)in_RDI,pgVar3 + sVar2,n_,pvVar4 + sVar2 * 0xf + (ulong)n_);
  return (locator *)pos_00;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }